

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O0

Type_error *
attr_wrapper::genTypeError(Type_error *__return_storage_ptr__,string *name,string *type)

{
  string local_60 [32];
  string local_40 [8];
  string toReturn;
  string *type_local;
  string *name_local;
  
  std::__cxx11::string::string(local_40,(string *)name);
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" is not a");
  std::__cxx11::string::operator+=(local_40,local_60);
  std::__cxx11::string::~string(local_60);
  Type_error::runtime_error(__return_storage_ptr__,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Type_error genTypeError(const std::string& name,
                                  const std::string& type)
   {
      std::string toReturn = name;
      toReturn += " is not a" + type;
      return Type_error(toReturn);
   }